

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strscan.c
# Opt level: O3

StrScanFmt
strscan_dec(uint8_t *p,TValue *o,StrScanFmt fmt,uint32_t opt,int32_t ex10,int32_t neg,uint32_t dig)

{
  uint32_t uVar1;
  uint uVar2;
  uint32_t uVar3;
  int iVar4;
  byte *pbVar5;
  byte bVar6;
  long lVar7;
  byte *__s;
  byte bVar8;
  uint uVar9;
  int iVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  int iVar14;
  ulong uVar16;
  ulong uVar17;
  uint uVar18;
  bool bVar19;
  double dVar20;
  uint8_t xi [512];
  undefined4 local_23c;
  byte local_238 [520];
  ulong uVar15;
  
  if (dig == 0) {
    __s = local_238;
    local_238[0] = 0;
    uVar16 = 0;
    goto LAB_001164d1;
  }
  uVar16 = 0;
  iVar4 = dig - 800;
  if (dig < 800) {
    iVar4 = 0;
  }
  uVar2 = 800;
  if (dig < 800) {
    uVar2 = dig;
  }
  uVar12 = iVar4 + ex10;
  if (((uVar12 ^ uVar2) & 1) != 0) {
    bVar6 = *p;
    if (bVar6 == 0x2e) {
      bVar6 = p[1];
      p = p + 1;
    }
    local_238[0] = bVar6 & 0xf;
    uVar2 = uVar2 - 1;
    p = p + 1;
    uVar16 = 1;
  }
  uVar17 = uVar16;
  if (1 < uVar2) {
    uVar17 = (ulong)((uVar2 - 2 >> 1) + (int)uVar16 + 1);
    do {
      bVar6 = *p;
      if (bVar6 == 0x2e) {
        bVar6 = p[1];
        p = p + 1;
      }
      bVar8 = p[1];
      lVar7 = 1;
      if (bVar8 == 0x2e) {
        bVar8 = p[2];
        lVar7 = 2;
      }
      local_238[uVar16] = (bVar8 & 0xf) + (bVar6 & 0xf) * '\n';
      uVar16 = uVar16 + 1;
      p = p + lVar7 + 1;
      uVar2 = uVar2 - 2;
    } while (uVar17 != uVar16);
  }
  if (uVar2 != 0) {
    bVar6 = *p;
    if (bVar6 == 0x2e) {
      bVar6 = p[1];
      p = p + 1;
    }
    local_238[uVar17] = (bVar6 & 0xf) * '\n';
    uVar17 = uVar17 + 1;
    uVar12 = uVar12 - 1;
    dig = dig + 1;
    p = p + 1;
  }
  __s = local_238 + uVar17;
  if (dig < 0x321) {
    if (dig < 0x13 && 0 < (int)uVar12) {
      iVar4 = 0x11 - dig;
      if (0x11 < dig) {
        iVar4 = 0;
      }
      uVar2 = iVar4 + 1U >> 1;
      iVar4 = uVar12 - 2;
      if (uVar12 < 2) {
        iVar4 = 0;
      }
      uVar18 = iVar4 + 1U >> 1;
      if (uVar2 < uVar18) {
        uVar18 = uVar2;
      }
      local_23c = neg;
      memset(__s,0,(ulong)uVar18 + 1);
      uVar17 = uVar17 + uVar18 + 1;
      uVar12 = (uVar12 + uVar18 * -2) - 2;
      dig = dig + 2 + uVar18 * 2;
      neg = local_23c;
    }
    __s = local_238 + uVar17;
    if ((uVar12 != 0) || (0x14 < dig)) goto LAB_00116605;
    uVar16 = (ulong)local_238[0];
    if (1 < uVar17) {
      pbVar5 = local_238 + 1;
      do {
        uVar16 = (ulong)*pbVar5 + uVar16 * 100;
        pbVar5 = pbVar5 + 1;
      } while (pbVar5 < __s);
    }
    if (dig == 0x14) {
      uVar12 = 0;
      if ((0x12 < local_238[0]) || (uVar12 = 0, -1 < (long)uVar16)) goto LAB_00116605;
    }
LAB_001164d1:
    iVar4 = (int)__s;
    if (fmt - STRSCAN_I64 < 2) {
      uVar17 = -uVar16;
      goto LAB_001166a5;
    }
    uVar1 = (uint32_t)uVar16;
    if (fmt == STRSCAN_U32) {
LAB_0011664a:
      if (uVar16 >> 0x20 != 0) {
        return STRSCAN_ERROR;
      }
      uVar3 = -uVar1;
      if (neg == 0) {
        uVar3 = uVar1;
      }
      (o->u32).lo = uVar3;
      return STRSCAN_U32;
    }
    if (fmt == STRSCAN_INT) {
      if (((opt & 2) == 0) && (uVar16 < (neg | 0x80000000))) {
        uVar3 = -uVar1;
        if (neg == 0) {
          uVar3 = uVar1;
        }
        (o->u32).lo = uVar3;
        return STRSCAN_INT;
      }
      fmt = STRSCAN_NUM;
      if ((opt & 0x10) != 0) goto LAB_0011664a;
    }
    if (-1 < (long)uVar16) {
      dVar20 = (double)(long)uVar16;
      if (neg != 0) {
        dVar20 = -dVar20;
      }
      goto LAB_001166cb;
    }
    uVar12 = 0;
LAB_0011666c:
    if (STRSCAN_INT < fmt) {
      return STRSCAN_ERROR;
    }
  }
  else {
    do {
      bVar6 = *p;
      if (bVar6 == 0x2e) {
        bVar6 = p[1];
        p = p + 1;
      }
      if (bVar6 != 0x30) {
        local_238[uVar17 - 1] = local_238[uVar17 - 1] | 1;
        break;
      }
      p = p + 1;
      dig = dig - 1;
    } while (800 < dig);
LAB_00116605:
    iVar4 = (int)__s;
    if (fmt != STRSCAN_INT) goto LAB_0011666c;
    fmt = STRSCAN_NUM;
    if ((opt & 0x10) != 0) {
      return STRSCAN_ERROR;
    }
  }
  uVar2 = iVar4 - (int)local_238;
  uVar12 = ((int)uVar12 >> 1) + uVar2;
  if ((int)uVar12 < 0x9c) {
    if (-0xa4 < (int)uVar12) {
      uVar16 = 0;
      iVar4 = 0;
      if ((int)uVar12 < 9) {
        uVar16 = 0;
        do {
          uVar18 = (uint)uVar16;
          if ((int)(uVar2 - uVar18 & 0x1ff) <= (int)uVar12) goto LAB_00116887;
          uVar17 = (ulong)(uVar2 - 1 & 0x1ff);
          uVar11 = (uint)local_238[uVar17] * 0x147b0;
          uVar9 = (uint)local_238[uVar17] << 6;
          while( true ) {
            uVar11 = uVar11 >> 0x11;
            iVar10 = uVar11 * -100 + uVar9;
            local_238[uVar17] = (byte)iVar10;
            uVar13 = (uint)uVar17;
            if (uVar13 == uVar18) break;
            if ((uVar2 - 1 & 0x1ff) == uVar13 && iVar10 == 0) {
              uVar2 = uVar13;
            }
            uVar17 = (ulong)(uVar13 - 1 & 0x1ff);
            uVar9 = (uint)local_238[uVar17] * 0x40 + uVar11;
            uVar11 = (uVar9 >> 2) * 0x147b;
          }
          if (99 < uVar9) {
            uVar13 = uVar18 - 1 & 0x1ff;
            uVar16 = (ulong)uVar13;
            uVar9 = uVar2 - 1 & 0x1ff;
            uVar18 = uVar9;
            if ((local_238[uVar9] != 0) && (uVar18 = uVar2, uVar13 == uVar2)) {
              local_238[uVar2 + 0x1fe & 0x1ff] = local_238[uVar2 + 0x1fe & 0x1ff] | local_238[uVar9]
              ;
              uVar18 = uVar9;
            }
            uVar2 = uVar18;
            local_238[uVar16] = (byte)uVar11;
            uVar12 = uVar12 + 1;
          }
          iVar4 = iVar4 + -6;
        } while ((int)uVar12 < 9);
      }
      uVar17 = uVar16;
      if (uVar12 < 10) {
        uVar12 = 9;
      }
      else {
        do {
          uVar18 = 0;
          uVar15 = uVar17;
          do {
            iVar14 = (int)uVar15;
            iVar10 = (int)uVar17;
            uVar11 = local_238[uVar17] + uVar18;
            local_238[uVar17] = (byte)(uVar11 >> 6);
            uVar9 = uVar11 & 0x3f;
            uVar18 = uVar9 * 100;
            bVar19 = (uVar11 & 0x3fc0) == 0;
            uVar16 = (ulong)(iVar14 + 1U & 0x1ff);
            if (iVar10 != iVar14 || !bVar19) {
              uVar16 = uVar15;
            }
            uVar12 = uVar12 - (iVar10 == iVar14 && bVar19);
            uVar13 = iVar10 + 1U & 0x1ff;
            uVar17 = (ulong)uVar13;
            uVar15 = uVar16;
            uVar11 = uVar2;
          } while (uVar13 != uVar2);
          while (uVar2 = uVar11, uVar9 != 0) {
            uVar2 = (uint)uVar16;
            if (uVar2 == uVar11) {
              local_238[uVar2 - 1 & 0x1ff] = local_238[uVar2 - 1 & 0x1ff] | 1;
              break;
            }
            local_238[uVar11] = (byte)(uVar18 >> 6);
            uVar9 = uVar18 & 0x3c;
            uVar18 = uVar9 * 100;
            uVar11 = uVar11 + 1 & 0x1ff;
          }
          iVar4 = iVar4 + 6;
          uVar17 = uVar16;
        } while (9 < (int)uVar12);
      }
LAB_00116887:
      uVar17 = (ulong)local_238[uVar16];
      uVar9 = (int)uVar16 + 1U & 0x1ff;
      uVar18 = uVar12 - 1;
      uVar11 = uVar18;
      if (1 < (int)uVar12) {
        do {
          uVar18 = uVar11;
          if (uVar9 == uVar2) break;
          uVar17 = (ulong)local_238[uVar9] + uVar17 * 100;
          uVar9 = uVar9 + 1 & 0x1ff;
          uVar18 = uVar11 - 1;
          bVar19 = 1 < uVar11;
          uVar11 = uVar18;
        } while (bVar19);
      }
      if (uVar9 == uVar2) {
        if (0 < (int)uVar18) {
          uVar18 = uVar18 + 1;
          do {
            uVar17 = uVar17 * 100;
            uVar18 = uVar18 - 1;
          } while (1 < uVar18);
        }
      }
      else {
        uVar17 = uVar17 * 2;
        iVar4 = iVar4 + -1;
        do {
          if (local_238[uVar9] != 0) {
            uVar17 = uVar17 | 1;
            break;
          }
          uVar9 = uVar9 + 1 & 0x1ff;
        } while (uVar9 != uVar2);
      }
      strscan_double(uVar17,o,iVar4,neg);
      return fmt;
    }
    dVar20 = 0.0;
    if (neg != 0) {
      dVar20 = -0.0;
    }
LAB_001166cb:
    o->u64 = (uint64_t)dVar20;
    return fmt;
  }
  uVar16 = 0x7ff0000000000000;
  uVar17 = 0xfff0000000000000;
LAB_001166a5:
  if (neg == 0) {
    uVar17 = uVar16;
  }
  o->u64 = uVar17;
  return fmt;
}

Assistant:

static StrScanFmt strscan_dec(const uint8_t *p, TValue *o,
			      StrScanFmt fmt, uint32_t opt,
			      int32_t ex10, int32_t neg, uint32_t dig)
{
  uint8_t xi[STRSCAN_DDIG], *xip = xi;

  if (dig) {
    uint32_t i = dig;
    if (i > STRSCAN_MAXDIG) {
      ex10 += (int32_t)(i - STRSCAN_MAXDIG);
      i = STRSCAN_MAXDIG;
    }
    /* Scan unaligned leading digit. */
    if (((ex10^i) & 1))
      *xip++ = ((*p != '.' ? *p : *++p) & 15), i--, p++;
    /* Scan aligned double-digits. */
    for ( ; i > 1; i -= 2) {
      uint32_t d = 10 * ((*p != '.' ? *p : *++p) & 15); p++;
      *xip++ = d + ((*p != '.' ? *p : *++p) & 15); p++;
    }
    /* Scan and realign trailing digit. */
    if (i) *xip++ = 10 * ((*p != '.' ? *p : *++p) & 15), ex10--, dig++, p++;

    /* Summarize rounding-effect of excess digits. */
    if (dig > STRSCAN_MAXDIG) {
      do {
	if ((*p != '.' ? *p : *++p) != '0') { xip[-1] |= 1; break; }
	p++;
      } while (--dig > STRSCAN_MAXDIG);
      dig = STRSCAN_MAXDIG;
    } else {  /* Simplify exponent. */
      while (ex10 > 0 && dig <= 18) *xip++ = 0, ex10 -= 2, dig += 2;
    }
  } else {  /* Only got zeros. */
    ex10 = 0;
    xi[0] = 0;
  }

  /* Fast path for numbers in integer format (but handles e.g. 1e6, too). */
  if (dig <= 20 && ex10 == 0) {
    uint8_t *xis;
    uint64_t x = xi[0];
    double n;
    for (xis = xi+1; xis < xip; xis++) x = x * 100 + *xis;
    if (!(dig == 20 && (xi[0] > 18 || (int64_t)x >= 0))) {  /* No overflow? */
      /* Format-specific handling. */
      switch (fmt) {
      case STRSCAN_INT:
	if (!(opt & STRSCAN_OPT_TONUM) && x < 0x80000000u+neg) {
	  o->i = neg ? (int32_t)(~x+1u) : (int32_t)x;
	  return STRSCAN_INT;  /* Fast path for 32 bit integers. */
	}
	if (!(opt & STRSCAN_OPT_C)) { fmt = STRSCAN_NUM; goto plainnumber; }
	/* fallthrough */
      case STRSCAN_U32:
	if ((x >> 32) != 0) return STRSCAN_ERROR;
	o->i = neg ? (int32_t)(~x+1u) : (int32_t)x;
	return STRSCAN_U32;
      case STRSCAN_I64:
      case STRSCAN_U64:
	o->u64 = neg ? ~x+1u : x;
	return fmt;
      default:
      plainnumber:  /* Fast path for plain numbers < 2^63. */
	if ((int64_t)x < 0) break;
	n = (double)(int64_t)x;
	if (neg) n = -n;
	o->n = n;
	return fmt;
      }
    }
  }

  /* Slow non-integer path. */
  if (fmt == STRSCAN_INT) {
    if ((opt & STRSCAN_OPT_C)) return STRSCAN_ERROR;
    fmt = STRSCAN_NUM;
  } else if (fmt > STRSCAN_INT) {
    return STRSCAN_ERROR;
  }
  {
    uint32_t hi = 0, lo = (uint32_t)(xip-xi);
    int32_t ex2 = 0, idig = (int32_t)lo + (ex10 >> 1);

    lj_assertX(lo > 0 && (ex10 & 1) == 0, "bad lo %d ex10 %d", lo, ex10);

    /* Handle simple overflow/underflow. */
    if (idig > 310/2) { if (neg) setminfV(o); else setpinfV(o); return fmt; }
    else if (idig < -326/2) { o->n = neg ? -0.0 : 0.0; return fmt; }

    /* Scale up until we have at least 17 or 18 integer part digits. */
    while (idig < 9 && idig < DLEN(lo, hi)) {
      uint32_t i, cy = 0;
      ex2 -= 6;
      for (i = DPREV(lo); ; i = DPREV(i)) {
	uint32_t d = (xi[i] << 6) + cy;
	cy = (((d >> 2) * 5243) >> 17); d = d - cy * 100;  /* Div/mod 100. */
	xi[i] = (uint8_t)d;
	if (i == hi) break;
	if (d == 0 && i == DPREV(lo)) lo = i;
      }
      if (cy) {
	hi = DPREV(hi);
	if (xi[DPREV(lo)] == 0) lo = DPREV(lo);
	else if (hi == lo) { lo = DPREV(lo); xi[DPREV(lo)] |= xi[lo]; }
	xi[hi] = (uint8_t)cy; idig++;
      }
    }

    /* Scale down until no more than 17 or 18 integer part digits remain. */
    while (idig > 9) {
      uint32_t i = hi, cy = 0;
      ex2 += 6;
      do {
	cy += xi[i];
	xi[i] = (cy >> 6);
	cy = 100 * (cy & 0x3f);
	if (xi[i] == 0 && i == hi) hi = DNEXT(hi), idig--;
	i = DNEXT(i);
      } while (i != lo);
      while (cy) {
	if (hi == lo) { xi[DPREV(lo)] |= 1; break; }
	xi[lo] = (cy >> 6); lo = DNEXT(lo);
	cy = 100 * (cy & 0x3f);
      }
    }

    /* Collect integer part digits and convert to rescaled double. */
    {
      uint64_t x = xi[hi];
      uint32_t i;
      for (i = DNEXT(hi); --idig > 0 && i != lo; i = DNEXT(i))
	x = x * 100 + xi[i];
      if (i == lo) {
	while (--idig >= 0) x = x * 100;
      } else {  /* Gather round bit from remaining digits. */
	x <<= 1; ex2--;
	do {
	  if (xi[i]) { x |= 1; break; }
	  i = DNEXT(i);
	} while (i != lo);
      }
      strscan_double(x, o, ex2, neg);
    }
  }
  return fmt;
}